

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  msg_type mVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __uniq_ptr_data<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>,_true,_true>
  _Var4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  undefined8 uVar7;
  size_t sVar8;
  iterator iVar9;
  int iVar10;
  int iVar11;
  _Any_data local_150;
  _Manager_type local_140;
  code *local_138;
  undefined1 local_129;
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  raft_server *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  raft_server *local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  char *local_a0;
  char *local_40;
  
  peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = "receive an rpc error response from peer server, %s";
  uVar7 = (**(code **)(*(long *)err + 0x10))(err);
  snprintf((char *)&local_108,200,"receive an rpc error response from peer server, %s",uVar7);
  local_150._M_unused._M_object = &local_140;
  sVar8 = strlen((char *)&local_108);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,&local_108,(long)&local_108 + sVar8);
  (*peVar2->_vptr_logger[2])(peVar2,&local_150);
  if ((_Manager_type *)local_150._M_unused._0_8_ != &local_140) {
    operator_delete(local_150._M_unused._M_object,(ulong)(local_140 + 1));
  }
  peVar3 = (err->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (err->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  mVar1 = (peVar3->super_msg_base).type_;
  if ((mVar1 == sync_log_request) || (mVar1 == join_cluster_request)) {
    _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (this->srv_to_join_).
                super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_120,
               &(this->srv_to_join_).
                super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    if (mVar1 != leave_cluster_request) goto LAB_00151183;
    local_128 = (element_type *)0x0;
    _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
    local_108 = (raft_server *)CONCAT44(local_108._4_4_,(peVar3->super_msg_base).dst_);
    iVar9 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_108);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_128 = *(element_type **)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                          ._M_cur + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_120,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                        ._M_cur + 0x18));
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  }
  if (local_128 != (element_type *)0x0) {
    _Var4.
    super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>.
    _M_t.
    super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
    .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl =
         (((this->ctx_)._M_t.
           super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>.
           _M_t.
           super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
           .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_)._M_t.
         super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
    ;
    iVar10 = *(int *)((long)_Var4.
                            super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
                            .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl +
                     8);
    iVar11 = *(int *)((long)_Var4.
                            super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
                            .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl +
                     4) - iVar10 / 2;
    if (iVar11 < iVar10) {
      iVar11 = iVar10;
    }
    if (local_128->current_hb_interval_ < iVar11) {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_108 = (raft_server *)local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"retry the request","");
      (*peVar2->_vptr_logger[2])(peVar2,&local_108);
      if (local_108 != (raft_server *)local_f8) {
        operator_delete(local_108,local_f8._0_8_ + 1);
      }
      iVar10 = local_128->rpc_backoff_ + local_128->current_hb_interval_;
      if (local_128->max_hb_interval_ <= iVar10) {
        iVar10 = local_128->max_hb_interval_;
      }
      local_128->current_hb_interval_ = iVar10;
      uStack_100 = local_128;
      local_f8._0_8_ = _Stack_120._M_pi;
      if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_150._8_8_ = 0;
      local_108 = this;
      local_f8._8_8_ = peVar3;
      local_e8 = this_00;
      local_150._M_unused._M_object = operator_new(0x28);
      uVar7 = local_f8._0_8_;
      *(raft_server **)local_150._M_unused._0_8_ = local_108;
      *(element_type **)((long)local_150._M_unused._0_8_ + 8) = uStack_100;
      uStack_100 = (element_type *)0x0;
      local_f8._0_8_ = (_func_int **)0x0;
      *(undefined8 *)((long)local_150._M_unused._0_8_ + 0x10) = uVar7;
      *(undefined8 *)((long)local_150._M_unused._0_8_ + 0x18) = local_f8._8_8_;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_150._M_unused._0_8_ + 0x20) =
           local_e8;
      local_138 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_resp_handlers.cxx:460:51)>
                  ::_M_invoke;
      local_140 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_resp_handlers.cxx:460:51)>
                  ::_M_manager;
      local_118 = (raft_server *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cornerstone::timer_task<void>,std::allocator<cornerstone::timer_task<void>>,std::function<void()>&>
                (&_Stack_110,(timer_task<void> **)&local_118,
                 (allocator<cornerstone::timer_task<void>_> *)&local_129,
                 (function<void_()> *)&local_150);
      local_108 = local_118;
      uStack_100 = (element_type *)CONCAT44(_Stack_110._M_pi._4_4_,_Stack_110._M_pi._0_4_);
      peVar6 = (this->scheduler_).
               super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar6->_vptr_delayed_task_scheduler[2])
                (peVar6,&local_108,(ulong)(uint)local_128->current_hb_interval_);
      if (uStack_100 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_100);
      }
      if (local_140 != (_Manager_type)0x0) {
        (*local_140)(&local_150,&local_150,__destroy_functor);
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((peVar3->super_msg_base).type_ == leave_cluster_request) {
        local_40 = "rpc failed again for the removing server (%d), will remove this server directly"
        ;
        snprintf((char *)&local_108,200,
                 "rpc failed again for the removing server (%d), will remove this server directly",
                 (ulong)(uint)((local_128->config_).
                               super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->id_);
        local_150._M_unused._M_object = &local_140;
        sVar8 = strlen((char *)&local_108);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,&local_108,(long)&local_108 + sVar8);
        (*peVar2->_vptr_logger[3])(peVar2,&local_150);
        if ((_Manager_type *)local_150._M_unused._0_8_ != &local_140) {
          operator_delete(local_150._M_unused._M_object,(ulong)(local_140 + 1));
        }
        iVar10 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->peers_lock_);
        if (iVar10 == 0x23) {
          std::__throw_system_error(0x23);
        }
        if ((this->peers_)._M_h._M_element_count == 1) {
          local_108 = (raft_server *)
                      CONCAT44(local_108._4_4_,
                               ((local_128->config_).
                                super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->id_);
          iVar9 = std::
                  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_108);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_a0 = "peer %d cannot be found, no action for removing";
            snprintf((char *)&local_108,100,"peer %d cannot be found, no action for removing",
                     (ulong)(uint)((local_128->config_).
                                   super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
            local_150._M_unused._M_object = &local_140;
            sVar8 = strlen((char *)&local_108);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,&local_108,(long)&local_108 + sVar8);
            (*peVar2->_vptr_logger[3])(peVar2,&local_150);
          }
          else {
            lVar5 = *(long *)((long)iVar9.
                                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                                    ._M_cur + 0x10);
            *(undefined1 *)(lVar5 + 0x5a) = 0;
            (**(code **)(**(long **)(lVar5 + 0x10) + 0x18))
                      (*(long **)(lVar5 + 0x10),(long *)(lVar5 + 0x60));
            LOCK();
            *(undefined1 *)(*(long *)(lVar5 + 0x60) + 8) = 1;
            UNLOCK();
            std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&(this->peers_)._M_h,
                    (const_iterator)
                    iVar9.
                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                    ._M_cur);
            peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_a0 = "server %d is removed from cluster";
            snprintf((char *)&local_108,100,"server %d is removed from cluster",
                     (ulong)(uint)((local_128->config_).
                                   super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
            local_150._M_unused._M_object = &local_140;
            sVar8 = strlen((char *)&local_108);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,&local_108,(long)&local_108 + sVar8);
            (*peVar2->_vptr_logger[3])(peVar2,&local_150);
          }
          if ((_Manager_type *)local_150._M_unused._0_8_ != &local_140) {
            operator_delete(local_150._M_unused._M_object,(ulong)(local_140 + 1));
          }
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
        rm_srv_from_cluster(this,((local_128->config_).
                                  super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_);
      }
      else {
        local_40 = 
        "rpc failed again for the new coming server (%d), will stop retry for this server";
        snprintf((char *)&local_108,200,
                 "rpc failed again for the new coming server (%d), will stop retry for this server",
                 (ulong)(uint)((local_128->config_).
                               super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->id_);
        local_150._M_unused._M_object = &local_140;
        sVar8 = strlen((char *)&local_108);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,&local_108,(long)&local_108 + sVar8);
        (*peVar2->_vptr_logger[3])(peVar2,&local_150);
        if ((_Manager_type *)local_150._M_unused._0_8_ != &local_140) {
          operator_delete(local_150._M_unused._M_object,(ulong)(local_140 + 1));
        }
        this->config_changing_ = false;
        this_01 = (this->srv_to_join_).
                  super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
    }
  }
  if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
  }
LAB_00151183:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err)
{
    l_->debug(lstrfmt("receive an rpc error response from peer server, %s").fmt(err.what()));
    ptr<req_msg> req = err.req();
    if (req->get_type() == msg_type::sync_log_request || req->get_type() == msg_type::join_cluster_request ||
        req->get_type() == msg_type::leave_cluster_request)
    {
        ptr<peer> p;
        if (req->get_type() == msg_type::leave_cluster_request)
        {
            read_lock(peers_lock_);
            peer_itor pit = peers_.find(req->get_dst());
            if (pit != peers_.end())
            {
                p = pit->second;
            }
        }
        else
        {
            p = srv_to_join_;
        }

        if (p != nilptr)
        {
            if (p->get_current_hb_interval() >= ctx_->params_->max_hb_interval())
            {
                if (req->get_type() == msg_type::leave_cluster_request)
                {
                    l_->info(lstrfmt("rpc failed again for the removing server (%d), will remove this server directly")
                                 .fmt(p->get_id()));

                    /**
                     * In case of there are only two servers in the cluster, it safe to remove the server directly from
                     * peers as at most one config change could happen at a time prove: assume there could be two config
                     * changes at a time this means there must be a leader after previous leader offline, which is
                     * impossible (no leader could be elected after one server goes offline in case of only two servers
                     * in a cluster) so the bug https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E does not
                     * apply to cluster which only has two members
                     */
                    {
                        write_lock(peers_lock_);
                        if (peers_.size() == 1)
                        {
                            peer_itor pit = peers_.find(p->get_id());
                            if (pit != peers_.end())
                            {
                                pit->second->enable_hb(false);
                                peers_.erase(pit);
                                l_->info(sstrfmt("server %d is removed from cluster").fmt(p->get_id()));
                            }
                            else
                            {
                                l_->info(sstrfmt("peer %d cannot be found, no action for removing").fmt(p->get_id()));
                            }
                        }
                    }

                    rm_srv_from_cluster(p->get_id());
                }
                else
                {
                    l_->info(lstrfmt("rpc failed again for the new coming server (%d), will stop retry for this server")
                                 .fmt(p->get_id()));
                    config_changing_ = false;
                    srv_to_join_.reset();
                }
            }
            else
            {
                // reuse the heartbeat interval value to indicate when to stop retrying, as rpc backoff is the same
                l_->debug("retry the request");
                p->slow_down_hb();
                timer_task<void>::executor exec = [this, p, req]() mutable { this->on_retryable_req_err(p, req); };
                ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
                scheduler_->schedule(task, p->get_current_hb_interval());
            }
        }
    }
}